

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O0

bool __thiscall
sptk::SymmetricMatrix::GetDiagonal
          (SymmetricMatrix *this,vector<double,_std::allocator<double>_> *diagonal_elements)

{
  double dVar1;
  size_type sVar2;
  const_reference ppdVar3;
  reference pvVar4;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  int i;
  int local_1c;
  vector<double,_std::allocator<double>_> *this_00;
  bool local_1;
  
  if (in_RSI == (vector<double,_std::allocator<double>_> *)0x0) {
    local_1 = false;
  }
  else {
    this_00 = in_RDI;
    sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
    if (sVar2 != (long)*(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,(size_type)in_RSI);
    }
    for (local_1c = 0;
        local_1c <
        *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish; local_1c = local_1c + 1) {
      ppdVar3 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                          ((vector<double_*,_std::allocator<double_*>_> *)
                           &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(long)local_1c);
      dVar1 = (*ppdVar3)[local_1c];
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_1c);
      *pvVar4 = dVar1;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SymmetricMatrix::GetDiagonal(
    std::vector<double>* diagonal_elements) const {
  if (NULL == diagonal_elements) {
    return false;
  }
  if (diagonal_elements->size() != static_cast<std::size_t>(num_dimension_)) {
    diagonal_elements->resize(num_dimension_);
  }
  for (int i(0); i < num_dimension_; ++i) {
    (*diagonal_elements)[i] = index_[i][i];
  }
  return true;
}